

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QString * __thiscall QAccessibleMenu::text(QAccessibleMenu *this,Text t)

{
  long lVar1;
  bool bVar2;
  int in_EDX;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QString tx;
  QString *in_stack_ffffffffffffffa8;
  QWidget *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QAccessibleWidget::text((QAccessibleWidget *)&DAT_aaaaaaaaaaaaaaaa,0xaaaaaaaa);
  bVar2 = QString::isEmpty((QString *)0x7dabb7);
  if (bVar2) {
    if (in_EDX == 0) {
      menu((QAccessibleMenu *)0x7dabe5);
      QWidget::windowTitle(this_00);
    }
    else {
      QString::QString((QString *)in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffffa8);
  }
  QString::~QString((QString *)0x7dac1d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenu::text(QAccessible::Text t) const
{
    QString tx = QAccessibleWidget::text(t);
    if (!tx.isEmpty())
        return tx;

    if (t == QAccessible::Name)
        return menu()->windowTitle();
    return tx;
}